

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O0

void telnet_iac(telnet_t *telnet,uchar cmd)

{
  char local_13;
  uchar local_12;
  uchar local_11;
  uchar bytes [2];
  telnet_t *ptStack_10;
  uchar cmd_local;
  telnet_t *telnet_local;
  
  local_13 = -1;
  local_12 = cmd;
  local_11 = cmd;
  ptStack_10 = telnet;
  _send(telnet,&local_13,2);
  return;
}

Assistant:

void telnet_iac(telnet_t *telnet, unsigned char cmd) {
	unsigned char bytes[2];
	bytes[0] = TELNET_IAC;
	bytes[1] = cmd;
	_sendu(telnet, bytes, 2);
}